

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine_unix.cpp
# Opt level: O0

bool QFileSystemEngine::setPermissions(int fd,Permissions permissions,QSystemError *error)

{
  long lVar1;
  mode_t __mode;
  int iVar2;
  int *piVar3;
  QSystemError *in_RDX;
  int in_EDI;
  long in_FS_OFFSET;
  bool success;
  mode_t mode;
  QSystemError local_18 [2];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __mode = QtPrivate::toMode_t((QFlagsStorageHelper<QFileDevice::Permission,_4>)
                               SUB84((ulong)lVar1 >> 0x20,0));
  iVar2 = fchmod(in_EDI,__mode);
  if (iVar2 != 0) {
    piVar3 = __errno_location();
    QSystemError::QSystemError(local_18,*piVar3,StandardLibraryError);
    *in_RDX = local_18[0];
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemEngine::setPermissions(int fd, QFile::Permissions permissions, QSystemError &error)
{
    mode_t mode = QtPrivate::toMode_t(permissions);
    bool success = ::fchmod(fd, mode) == 0;
    if (!success)
        error = QSystemError(errno, QSystemError::StandardLibraryError);
    return success;
}